

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.hpp
# Opt level: O0

container<pstore::repo::external_fixup> __thiscall
pstore::repo::section_dispatcher::xfixups(section_dispatcher *this)

{
  container<pstore::repo::external_fixup> cVar1;
  section_dispatcher *this_local;
  
  cVar1 = generic_section::xfixups(this->s_);
  return cVar1;
}

Assistant:

container<external_fixup> xfixups () const final { return s_.xfixups (); }